

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warped_motion.c
# Opt level: O1

int av1_get_shear_params(WarpedMotionParams *wm)

{
  uint16_t uVar1;
  int iVar2;
  uint uVar3;
  byte bVar4;
  byte bVar5;
  ushort uVar6;
  uint uVar7;
  ushort uVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  ushort uVar13;
  int iVar14;
  ushort uVar15;
  int32_t *mat;
  ushort uVar16;
  short sVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  short sVar22;
  
  uVar11 = wm->wmmat[2];
  uVar3 = 0;
  if (0 < (int)uVar11) {
    uVar7 = 0x17fff;
    if ((int)uVar11 < 0x17fff) {
      uVar7 = uVar11;
    }
    sVar17 = -0x8000;
    if (0x8000 < (int)uVar7) {
      sVar17 = (short)uVar7;
    }
    wm->alpha = sVar17;
    iVar2 = wm->wmmat[3];
    iVar18 = 0x7fff;
    if (iVar2 < 0x7fff) {
      iVar18 = iVar2;
    }
    iVar14 = -0x8000;
    if (-0x8000 < iVar18) {
      iVar14 = iVar18;
    }
    uVar7 = 0x1f;
    if (uVar11 != 0) {
      for (; uVar11 >> uVar7 == 0; uVar7 = uVar7 - 1) {
      }
    }
    bVar4 = (byte)uVar7;
    wm->beta = (int16_t)iVar14;
    iVar18 = (-1 << (bVar4 & 0x1f)) + uVar11;
    if (uVar7 < 9) {
      iVar18 = iVar18 << (8 - bVar4 & 0x1f);
    }
    else {
      bVar5 = 0x17 - (bVar4 ^ 0x1f);
      iVar18 = (int)(iVar18 + ((uint)(1 << (bVar5 & 0x1f)) >> 1)) >> (bVar5 & 0x1f);
    }
    bVar4 = bVar4 + 0xe;
    uVar1 = div_lut[iVar18];
    iVar18 = wm->wmmat[4];
    lVar20 = (long)iVar18 * (long)(short)uVar1;
    lVar21 = lVar20 * 0x10000;
    uVar10 = (ulong)(1L << (bVar4 & 0x3f)) >> 1;
    if (lVar21 < 0) {
      iVar9 = -(int)((long)(uVar10 + lVar20 * -0x10000) >> (bVar4 & 0x3f));
    }
    else {
      iVar9 = (int)(lVar21 + uVar10 >> (bVar4 & 0x3f));
    }
    iVar12 = 0x7fff;
    if (iVar9 < 0x7fff) {
      iVar12 = iVar9;
    }
    iVar19 = -0x8000;
    if (-0x8000 < iVar12) {
      iVar19 = iVar12;
    }
    wm->gamma = (int16_t)iVar19;
    lVar20 = (long)(short)uVar1 * (long)iVar2 * (long)iVar18;
    uVar10 = (ulong)(1L << (bVar4 & 0x3f)) >> 1;
    if (lVar20 < 0) {
      iVar18 = -(int)((long)(uVar10 - lVar20) >> (bVar4 & 0x3f));
    }
    else {
      iVar18 = (int)(lVar20 + uVar10 >> (bVar4 & 0x3f));
    }
    iVar18 = wm->wmmat[5] - iVar18;
    if (0x17ffe < iVar18) {
      iVar18 = 0x17fff;
    }
    sVar22 = -0x8000;
    if (0x8000 < iVar18) {
      sVar22 = (short)iVar18;
    }
    wm->delta = sVar22;
    if (sVar17 < 0) {
      uVar11 = -(0x20U - (int)sVar17 >> 6);
    }
    else {
      uVar11 = (int)sVar17 + 0x20U >> 6;
    }
    uVar6 = (ushort)(uVar11 << 6);
    wm->alpha = uVar6;
    if (iVar2 < 0) {
      uVar11 = -(0x20U - iVar14 >> 6);
    }
    else {
      uVar11 = iVar14 + 0x20U >> 6;
    }
    uVar16 = (ushort)(uVar11 << 6);
    wm->beta = uVar16;
    if (iVar9 < 0) {
      uVar11 = -(0x20U - iVar19 >> 6);
    }
    else {
      uVar11 = iVar19 + 0x20U >> 6;
    }
    uVar8 = (ushort)(uVar11 << 6);
    wm->gamma = uVar8;
    if (sVar22 < 0) {
      uVar11 = -(0x20U - (int)sVar22 >> 6);
    }
    else {
      uVar11 = (int)sVar22 + 0x20U >> 6;
    }
    uVar13 = (ushort)(uVar11 << 6);
    wm->delta = uVar13;
    uVar15 = -uVar6;
    if (0 < (short)uVar6) {
      uVar15 = uVar6;
    }
    uVar6 = -uVar16;
    if (0 < (short)uVar16) {
      uVar6 = uVar16;
    }
    if (((uint)uVar6 * 8 - (uint)uVar6) + (uint)uVar15 * 4 < 0x10000) {
      uVar6 = -uVar8;
      if (0 < (short)uVar8) {
        uVar6 = uVar8;
      }
      uVar16 = -uVar13;
      if (0 < (short)uVar13) {
        uVar16 = uVar13;
      }
      uVar3 = (uint)((uint)uVar16 + (uint)uVar6 < 0x4000);
    }
  }
  return uVar3;
}

Assistant:

int av1_get_shear_params(WarpedMotionParams *wm) {
#ifndef NDEBUG
  // Check that models have been constructed sensibly
  // This is a good place to check, because this function does not need to
  // be called until after model construction is complete, but must be called
  // before the model can be used for prediction.
  check_model_consistency(wm);
#endif  // NDEBUG

  const int32_t *mat = wm->wmmat;
  if (!is_affine_valid(wm)) return 0;

  wm->alpha =
      clamp(mat[2] - (1 << WARPEDMODEL_PREC_BITS), INT16_MIN, INT16_MAX);
  wm->beta = clamp(mat[3], INT16_MIN, INT16_MAX);
  int16_t shift;
  int16_t y = resolve_divisor_32(abs(mat[2]), &shift) * (mat[2] < 0 ? -1 : 1);
  int64_t v = ((int64_t)mat[4] * (1 << WARPEDMODEL_PREC_BITS)) * y;
  wm->gamma =
      clamp((int)ROUND_POWER_OF_TWO_SIGNED_64(v, shift), INT16_MIN, INT16_MAX);
  v = ((int64_t)mat[3] * mat[4]) * y;
  wm->delta = clamp(mat[5] - (int)ROUND_POWER_OF_TWO_SIGNED_64(v, shift) -
                        (1 << WARPEDMODEL_PREC_BITS),
                    INT16_MIN, INT16_MAX);

  wm->alpha = ROUND_POWER_OF_TWO_SIGNED(wm->alpha, WARP_PARAM_REDUCE_BITS) *
              (1 << WARP_PARAM_REDUCE_BITS);
  wm->beta = ROUND_POWER_OF_TWO_SIGNED(wm->beta, WARP_PARAM_REDUCE_BITS) *
             (1 << WARP_PARAM_REDUCE_BITS);
  wm->gamma = ROUND_POWER_OF_TWO_SIGNED(wm->gamma, WARP_PARAM_REDUCE_BITS) *
              (1 << WARP_PARAM_REDUCE_BITS);
  wm->delta = ROUND_POWER_OF_TWO_SIGNED(wm->delta, WARP_PARAM_REDUCE_BITS) *
              (1 << WARP_PARAM_REDUCE_BITS);

  if (!is_affine_shear_allowed(wm->alpha, wm->beta, wm->gamma, wm->delta))
    return 0;

  return 1;
}